

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  _Elt_pointer ppVVar4;
  byte *pbVar5;
  ulong uVar6;
  ValueHolder local_70;
  undefined2 local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pbVar3 = (byte *)token->end_;
  cVar1 = *token->start_;
  pbVar5 = (byte *)(token->start_ + (cVar1 == '-'));
  if (pbVar5 == pbVar3) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
    std::operator+(&local_30,"\'",&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                   &local_30,"\' is not a valid number.");
    addError(this,(string *)&local_70,token,(Location)0x0);
LAB_001e645c:
    std::__cxx11::string::~string((string *)&local_70.bool_);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    return false;
  }
  for (uVar6 = 0; (pbVar5 < pbVar3 && ((long)uVar6 < 0x100000000));
      uVar6 = (ulong)(bVar2 & 0xf) + uVar6 * 10) {
    bVar2 = *pbVar5;
    if (9 < (byte)(bVar2 - 0x30)) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
      std::operator+(&local_30,"\'",&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     &local_30,"\' is not a number.");
      addError(this,(string *)&local_70,token,(Location)0x0);
      goto LAB_001e645c;
    }
    pbVar5 = pbVar5 + 1;
  }
  if (pbVar5 != pbVar3) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
    std::operator+(&local_30,"\'",&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                   &local_30,"\' exceeds the allowable range.");
    addError(this,(string *)&local_70,token,(Location)0x0);
    goto LAB_001e645c;
  }
  if (cVar1 == '-') {
    if (uVar6 - 0x80000001 < 0xffffffff00000000) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
      std::operator+(&local_30,"\'",&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     &local_30,"\' exceeds the allowable range.");
      addError(this,(string *)&local_70,token,(Location)0x0);
      goto LAB_001e645c;
    }
    uVar6 = (ulong)(uint)-(int)uVar6;
  }
  else {
    if (0xffffffff < (long)uVar6) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
      std::operator+(&local_30,"\'",&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     &local_30,"\' exceeds the allowable range.");
      addError(this,(string *)&local_70,token,(Location)0x0);
      goto LAB_001e645c;
    }
    if (0x7fffffff < (long)uVar6) {
      local_68 = 2;
      goto LAB_001e657e;
    }
  }
  local_68 = 1;
LAB_001e657e:
  local_70.int_ = (Int)uVar6;
  ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar4 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swap(ppVVar4[-1],(Value *)&local_70);
  Value::~Value((Value *)&local_70);
  return true;
}

Assistant:

bool
Reader::decodeNumber ( Token& token )
{
    Location current = token.start_;
    bool isNegative = *current == '-';

    if ( isNegative )
        ++current;

    if (current == token.end_)
    {
        return addError ( "'" + std::string ( token.start_, token.end_ ) +
            "' is not a valid number.", token );
    }

    // The existing Json integers are 32-bit so using a 64-bit value here avoids
    // overflows in the conversion code below.
    std::int64_t value = 0;

    static_assert(sizeof(value) > sizeof(Value::maxUInt),
        "The JSON integer overflow logic will need to be reworked.");

    while (current < token.end_ && (value <= Value::maxUInt))
    {
        Char c = *current++;

        if ( c < '0'  ||  c > '9' )
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' is not a number.", token );
        }

        value = (value * 10) + (c - '0');
    }

    // More tokens left -> input is larger than largest possible return value
    if (current != token.end_)
    {
        return addError ( "'" + std::string ( token.start_, token.end_ ) +
            "' exceeds the allowable range.", token );
    }

    if ( isNegative )
    {
        value = -value;

        if (value < Value::minInt || value > Value::maxInt)
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' exceeds the allowable range.", token );
        }

        currentValue () = static_cast<Value::Int>( value );
    }
    else
    {
        if (value > Value::maxUInt)
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' exceeds the allowable range.", token );
        }

        // If it's representable as a signed integer, construct it as one.
        if ( value <= Value::maxInt )
            currentValue () = static_cast<Value::Int>( value );
        else
            currentValue () = static_cast<Value::UInt>( value );
    }

    return true;
}